

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int Qiniu_Json_GetBoolean(Qiniu_Json *self,char *key,int defval)

{
  cJSON *pcVar1;
  Qiniu_Json *sub;
  int defval_local;
  char *key_local;
  Qiniu_Json *self_local;
  
  self_local._4_4_ = defval;
  if ((self != (Qiniu_Json *)0x0) &&
     (pcVar1 = cJSON_GetObjectItem(self,key), pcVar1 != (cJSON *)0x0)) {
    if (pcVar1->type == 0) {
      self_local._4_4_ = 0;
    }
    else if (pcVar1->type == 1) {
      self_local._4_4_ = 1;
    }
  }
  return self_local._4_4_;
}

Assistant:

int Qiniu_Json_GetBoolean(Qiniu_Json *self, const char *key, int defval)
{
    Qiniu_Json *sub;
    if (self == NULL)
    {
        return defval;
    } // if
    sub = cJSON_GetObjectItem(self, key);
    if (sub != NULL)
    {
        if (sub->type == cJSON_False)
        {
            return 0;
        }
        else if (sub->type == cJSON_True)
        {
            return 1;
        } // if
    }     // if
    return defval;
}